

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O0

INT32 regstr_to_idx(char *Reg)

{
  int iVar1;
  int local_1c;
  INT32 i;
  char *Reg_local;
  
  local_1c = 0;
  while( true ) {
    if (0xf < local_1c) {
      return -1;
    }
    iVar1 = strcasecmp(Reg,regstr_to_idx::reg64[local_1c]);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

INT32
regstr_to_idx(
    _In_ const char *Reg
    )
{
    static const char *reg64[] =
    {
        "rax", "rcx", "rdx", "rbx", "rsp", "rbp", "rsi", "rdi",
        "r8",  "r9",  "r10", "r11", "r12", "r13", "r14", "r15"
    };

    for (INT32 i = 0; i < (INT32)ARRAYSIZE(reg64); i++)
    {
        if (!_stricmp(Reg, reg64[i]))
        {
            return i;
        }
    }

    return -1;
}